

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  byte in_SIL;
  long in_RDI;
  float fVar1;
  float fVar2;
  float target_y;
  float cr_y;
  float cr_x;
  ImGuiContext *g;
  ImVec2 scroll;
  ImGuiWindow *in_stack_ffffffffffffffb0;
  ImVec2 *this;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  ImVec2 local_3c;
  ImVec2 local_34;
  float local_2c;
  float local_28;
  float local_24;
  ImGuiContext *local_20;
  byte local_11;
  long local_10;
  ImVec2 local_8;
  
  local_11 = in_SIL & 1;
  local_20 = GImGui;
  local_8 = *(ImVec2 *)(in_RDI + 0x5c);
  if (*(float *)(in_RDI + 100) <= 3.4028235e+38 && *(float *)(in_RDI + 100) != 3.4028235e+38) {
    local_24 = *(float *)(in_RDI + 0x6c);
    local_8.y = (float)((ulong)local_8 >> 0x20);
    local_8.x = -local_24 * (*(float *)(in_RDI + 0x20) - *(float *)(in_RDI + 0x74)) +
                *(float *)(in_RDI + 100);
  }
  local_10 = in_RDI;
  if (*(float *)(in_RDI + 0x68) <= 3.4028235e+38 && *(float *)(in_RDI + 0x68) != 3.4028235e+38) {
    local_28 = *(float *)(in_RDI + 0x70);
    local_2c = *(float *)(in_RDI + 0x68);
    if (((local_11 != 0) && (local_28 <= 0.0)) && (local_2c <= *(float *)(in_RDI + 0x44))) {
      local_2c = 0.0;
    }
    if (((local_11 != 0) && (1.0 <= local_28)) &&
       ((*(float *)(in_RDI + 0x34) - *(float *)(in_RDI + 0x44)) + (GImGui->Style).ItemSpacing.y <=
        local_2c)) {
      local_2c = *(float *)(in_RDI + 0x34);
    }
    fVar2 = local_2c;
    in_stack_ffffffffffffffbc = 1.0 - local_28;
    in_stack_ffffffffffffffb8 = ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffffb0);
    fVar1 = ImGuiWindow::MenuBarHeight(in_stack_ffffffffffffffb0);
    local_8.y = -local_28 * (*(float *)(local_10 + 0x24) - *(float *)(local_10 + 0x78)) +
                -in_stack_ffffffffffffffbc * (in_stack_ffffffffffffffb8 + fVar1) + fVar2;
  }
  this = &local_3c;
  ImVec2::ImVec2(this,0.0,0.0);
  local_34 = ImMax((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),this);
  local_8 = local_34;
  if (((*(byte *)(local_10 + 0x81) & 1) == 0) && ((*(byte *)(local_10 + 0x83) & 1) == 0)) {
    local_8.x = local_34.x;
    fVar2 = local_8.x;
    fVar1 = ImGui::GetWindowScrollMaxX((ImGuiWindow *)0x14a95c);
    fVar1 = ImMin<float>(fVar2,fVar1);
    fVar2 = local_8.y;
    local_8.x = fVar1;
    fVar1 = ImGui::GetWindowScrollMaxY((ImGuiWindow *)0x14a985);
    fVar2 = ImMin<float>(fVar2,fVar1);
    local_8.y = fVar2;
  }
  return local_8;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        scroll.x = window->ScrollTarget.x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->SizeContents.y - window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->SizeContents.y;
        scroll.y = target_y - (1.0f - cr_y) * (window->TitleBarHeight() + window->MenuBarHeight()) - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, ImGui::GetWindowScrollMaxX(window));
        scroll.y = ImMin(scroll.y, ImGui::GetWindowScrollMaxY(window));
    }
    return scroll;
}